

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O1

CExtKey * DecodeExtKey(CExtKey *__return_storage_ptr__,string *str)

{
  ChainCode *pCVar1;
  pointer __s1;
  pointer puVar2;
  base_blob<256U> *pbVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  CChainParams *pCVar7;
  pointer *__ptr;
  size_t __n;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  pCVar1 = &__return_storage_ptr__->chaincode;
  (pCVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  (__return_storage_ptr__->key).fCompressed = false;
  (__return_storage_ptr__->key).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar5 = DecodeBase58Check(str,&local_38,0x4e);
  if (bVar5) {
    pCVar7 = Params();
    puVar4 = local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s1 = pCVar7->base58Prefixes[4].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar2 = pCVar7->base58Prefixes[4].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar2 - (long)__s1;
    if ((long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == __n + 0x4a) {
      if (puVar2 != __s1) {
        iVar6 = bcmp(__s1,local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n);
        if (iVar6 != 0) goto LAB_001582ba;
      }
      CExtKey::Decode(__return_storage_ptr__,puVar4 + __n);
    }
  }
LAB_001582ba:
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CExtKey DecodeExtKey(const std::string& str)
{
    CExtKey key;
    std::vector<unsigned char> data;
    if (DecodeBase58Check(str, data, 78)) {
        const std::vector<unsigned char>& prefix = Params().Base58Prefix(CChainParams::EXT_SECRET_KEY);
        if (data.size() == BIP32_EXTKEY_SIZE + prefix.size() && std::equal(prefix.begin(), prefix.end(), data.begin())) {
            key.Decode(data.data() + prefix.size());
        }
    }
    return key;
}